

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_dsa_asn1.cc
# Opt level: O1

dsa_st * EVP_PKEY_get1_DSA(EVP_PKEY *pkey)

{
  DSA *r;
  
  if (pkey->save_type == 0x74) {
    r = *(DSA **)&pkey->references;
  }
  else {
    r = (DSA *)0x0;
    ERR_put_error(6,0,0x6c,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/evp/p_dsa_asn1.cc"
                  ,0x10b);
  }
  if (r != (DSA *)0x0) {
    DSA_up_ref(r);
  }
  return r;
}

Assistant:

DSA *EVP_PKEY_get1_DSA(const EVP_PKEY *pkey) {
  DSA *dsa = EVP_PKEY_get0_DSA(pkey);
  if (dsa != nullptr) {
    DSA_up_ref(dsa);
  }
  return dsa;
}